

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void * err_unwind(lua_State *L,void *stopcf,int errcode)

{
  int iVar1;
  ulong uVar2;
  int in_EDX;
  void *in_RSI;
  void *in_RDI;
  global_State *g;
  TValue *top;
  int32_t nres;
  void *cf;
  TValue *frame;
  TValue *in_stack_ffffffffffffffa8;
  lua_State *in_stack_ffffffffffffffb0;
  void *local_30;
  ulong local_28;
  
  local_28 = *(long *)((long)in_RDI + 0x10) - 8;
  local_30 = *(void **)((long)in_RDI + 0x30);
switchD_001153d9_default:
  if (local_30 == (void *)0x0) {
LAB_00115678:
    if (in_EDX != 0) {
      *(ulong *)((long)in_RDI + 0x10) = (ulong)*(uint *)((long)in_RDI + 0x24) + 8;
      *(undefined8 *)((long)in_RDI + 0x30) = 0;
      unwindstack(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (*(long *)((ulong)*(uint *)((long)in_RDI + 8) + 0x178) != 0) {
        (**(code **)((ulong)*(uint *)((long)in_RDI + 8) + 0x178))(in_RDI);
      }
      exit(1);
    }
    return in_RDI;
  }
  iVar1 = *(int *)(((ulong)local_30 & 0xfffffffffffffffc) + 0x10);
  if ((iVar1 < 0) && (local_28 < (ulong)*(uint *)((long)in_RDI + 0x24) + (long)-iVar1)) {
    if (in_EDX != 0) {
      *(ulong *)((long)in_RDI + 0x10) = local_28 + 8;
      *(undefined8 *)((long)in_RDI + 0x30) = *(undefined8 *)((long)local_30 + 0x30);
      unwindstack(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    return local_30;
  }
  if (local_28 <= *(uint *)((long)in_RDI + 0x24)) goto LAB_00115678;
  in_stack_ffffffffffffffb0 = (lua_State *)(ulong)(*(uint *)(local_28 + 4) & 7);
  switch(in_stack_ffffffffffffffb0) {
  case (lua_State *)0x0:
  case (lua_State *)0x4:
    local_28 = local_28 +
               (ulong)((*(uint *)((ulong)*(uint *)(local_28 + 4) - 4) >> 8 & 0xff) + 1) * -8;
    goto switchD_001153d9_default;
  case (lua_State *)0x1:
    break;
  case (lua_State *)0x2:
    if (*(int *)(local_28 - 8) != 1) goto switchD_001153d9_caseD_3;
    break;
  case (lua_State *)0x3:
switchD_001153d9_caseD_3:
    local_28 = local_28 - ((long)*(int *)(local_28 + 4) & 0xfffffffffffffff8U);
    goto switchD_001153d9_default;
  case (lua_State *)0x5:
    goto switchD_001153d9_caseD_5;
  case (lua_State *)0x6:
  case (lua_State *)0x7:
    if (in_EDX != 0) {
      if (in_EDX == 1) {
        local_28 = local_28 - ((long)*(int *)(local_28 + 4) & 0xfffffffffffffff8U);
        goto switchD_001153d9_default;
      }
      uVar2 = (ulong)*(uint *)((long)in_RDI + 8);
      *(int *)(uVar2 + 0x188) = (int)in_RDI;
      if ((*(uint *)(local_28 + 4) & 7) == 6) {
        *(byte *)(uVar2 + 0x109) = *(byte *)(uVar2 + 0x109) & 0xef;
      }
      *(ulong *)((long)in_RDI + 0x10) =
           (local_28 - ((long)*(int *)(local_28 + 4) & 0xfffffffffffffff8U)) + 8;
      *(void **)((long)in_RDI + 0x30) = local_30;
      unwindstack(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    return (void *)((ulong)local_30 | 2);
  default:
    goto switchD_001153d9_default;
  }
  if (in_EDX == 0) {
    if (local_30 != in_RSI) {
      local_30 = *(void **)((long)local_30 + 0x30);
      local_28 = local_28 - ((long)*(int *)(local_28 + 4) & 0xfffffffffffffff8U);
      goto switchD_001153d9_default;
    }
  }
  else {
    *(ulong *)((long)in_RDI + 0x10) =
         (local_28 - ((long)*(int *)(local_28 + 4) & 0xfffffffffffffff8U)) + 8;
    *(undefined8 *)((long)in_RDI + 0x30) = *(undefined8 *)((long)local_30 + 0x30);
    unwindstack(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return (void *)0x0;
switchD_001153d9_caseD_5:
  if (((ulong)local_30 & 1) == 0) {
    if (in_EDX != 0) {
      *(ulong *)((long)in_RDI + 0x10) =
           (local_28 - ((long)*(int *)(local_28 + 4) & 0xfffffffffffffff8U)) + 8;
      *(undefined8 *)((long)in_RDI + 0x30) = *(undefined8 *)((long)local_30 + 0x30);
      unwindstack(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
  }
  else if (in_EDX != 0) {
    *(byte *)((ulong)*(uint *)((long)in_RDI + 8) + 0x109) =
         *(byte *)((ulong)*(uint *)((long)in_RDI + 8) + 0x109) & 0xef;
    *(undefined8 *)((long)in_RDI + 0x30) = 0;
    *(char *)((long)in_RDI + 7) = (char)in_EDX;
  }
  return local_30;
}

Assistant:

static void *err_unwind(lua_State *L, void *stopcf, int errcode)
{
  TValue *frame = L->base-1;
  void *cf = L->cframe;
  while (cf) {
    int32_t nres = cframe_nres(cframe_raw(cf));
    if (nres < 0) {  /* C frame without Lua frame? */
      TValue *top = restorestack(L, -nres);
      if (frame < top) {  /* Frame reached? */
	if (errcode) {
	  L->base = frame+1;
	  L->cframe = cframe_prev(cf);
	  unwindstack(L, top);
	}
	return cf;
      }
    }
    if (frame <= tvref(L->stack)+LJ_FR2)
      break;
    switch (frame_typep(frame)) {
    case FRAME_LUA:  /* Lua frame. */
    case FRAME_LUAP:
      frame = frame_prevl(frame);
      break;
    case FRAME_C:  /* C frame. */
    unwind_c:
#if LJ_UNWIND_EXT
      if (errcode) {
	L->base = frame_prevd(frame) + 1;
	L->cframe = cframe_prev(cf);
	unwindstack(L, frame - LJ_FR2);
      } else if (cf != stopcf) {
	cf = cframe_prev(cf);
	frame = frame_prevd(frame);
	break;
      }
      return NULL;  /* Continue unwinding. */
#else
      UNUSED(stopcf);
      cf = cframe_prev(cf);
      frame = frame_prevd(frame);
      break;
#endif
    case FRAME_CP:  /* Protected C frame. */
      if (cframe_canyield(cf)) {  /* Resume? */
	if (errcode) {
	  hook_leave(G(L));  /* Assumes nobody uses coroutines inside hooks. */
	  L->cframe = NULL;
	  L->status = (uint8_t)errcode;
	}
	return cf;
      }
      if (errcode) {
	L->base = frame_prevd(frame) + 1;
	L->cframe = cframe_prev(cf);
	unwindstack(L, frame - LJ_FR2);
      }
      return cf;
    case FRAME_CONT:  /* Continuation frame. */
      if (frame_iscont_fficb(frame))
	goto unwind_c;
      /* fallthrough */
    case FRAME_VARG:  /* Vararg frame. */
      frame = frame_prevd(frame);
      break;
    case FRAME_PCALL:  /* FF pcall() frame. */
    case FRAME_PCALLH:  /* FF pcall() frame inside hook. */
      if (errcode) {
	global_State *g;
	if (errcode == LUA_YIELD) {
	  frame = frame_prevd(frame);
	  break;
	}
	g = G(L);
	setgcref(g->cur_L, obj2gco(L));
	if (frame_typep(frame) == FRAME_PCALL)
	  hook_leave(g);
	L->base = frame_prevd(frame) + 1;
	L->cframe = cf;
	unwindstack(L, L->base);
      }
      return (void *)((intptr_t)cf | CFRAME_UNWIND_FF);
    }
  }
  /* No C frame. */
  if (errcode) {
    L->base = tvref(L->stack)+1+LJ_FR2;
    L->cframe = NULL;
    unwindstack(L, L->base);
    if (G(L)->panic)
      G(L)->panic(L);
    exit(EXIT_FAILURE);
  }
  return L;  /* Anything non-NULL will do. */
}